

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * file_contents(string *__return_storage_ptr__,string *filename)

{
  undefined8 uVar1;
  runtime_error *this;
  ifstream ifs;
  long local_218 [4];
  byte abStack_1f8 [200];
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(local_218,(string *)filename,_S_in);
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
    std::ifstream::~ifstream(local_218);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Failed open file ");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string file_contents(const std::string &filename)
{
    std::ifstream ifs(filename);
    if (!ifs)
        throw std::runtime_error("Failed open file ");
    return std::string((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
}